

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

void stbiw__write_run_data(stbi__write_context *s,int length,uchar databyte)

{
  uchar lengthbyte;
  char local_a;
  uchar local_9;
  
  local_a = (char)length + -0x80;
  local_9 = databyte;
  if (length < 0x80) {
    (*s->func)(s->context,&local_a,1);
    (*s->func)(s->context,&local_9,1);
    return;
  }
  __assert_fail("length + 128 <= 255",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/RuiwenTang[P]TinyRender/third_party/stb_image_write.h"
                ,0x25b,"void stbiw__write_run_data(stbi__write_context *, int, unsigned char)");
}

Assistant:

void stbiw__write_run_data(stbi__write_context *s, int length,
                           unsigned char databyte) {
  unsigned char lengthbyte = STBIW_UCHAR(length + 128);
  STBIW_ASSERT(length + 128 <= 255);
  s->func(s->context, &lengthbyte, 1);
  s->func(s->context, &databyte, 1);
}